

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

ZSTD_CCtx * ZSTD_createCCtx_advanced(ZSTD_customMem customMem)

{
  ZSTD_customMem memManager;
  ZSTD_CCtx *cctx;
  code *in_stack_00000008;
  long in_stack_00000010;
  void *in_stack_00000018;
  
  if ((in_stack_00000010 == 0) == (in_stack_00000008 == (code *)0x0)) {
    if (in_stack_00000008 == (code *)0x0) {
      cctx = (ZSTD_CCtx *)malloc(0x488);
    }
    else {
      cctx = (ZSTD_CCtx *)(*in_stack_00000008)(in_stack_00000018,0x488);
    }
    if (cctx != (ZSTD_CCtx *)0x0) {
      memManager.customFree = (ZSTD_freeFunction)in_stack_00000010;
      memManager.customAlloc = in_stack_00000008;
      memManager.opaque = in_stack_00000018;
      ZSTD_initCCtx(cctx,memManager);
      return cctx;
    }
  }
  return (ZSTD_CCtx *)0x0;
}

Assistant:

ZSTD_CCtx* ZSTD_createCCtx_advanced(ZSTD_customMem customMem)
{
    ZSTD_STATIC_ASSERT(zcss_init==0);
    ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN==(0ULL - 1));
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;
    {   ZSTD_CCtx* const cctx = (ZSTD_CCtx*)ZSTD_malloc(sizeof(ZSTD_CCtx), customMem);
        if (!cctx) return NULL;
        ZSTD_initCCtx(cctx, customMem);
        return cctx;
    }
}